

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.h
# Opt level: O0

OneofDescriptor * __thiscall
google::protobuf::Descriptor::real_oneof_decl(Descriptor *this,int index)

{
  int iVar1;
  LogMessage *pLVar2;
  OneofDescriptor *pOVar3;
  LogMessage local_28;
  Voidify local_15;
  int local_14;
  Descriptor *pDStack_10;
  int index_local;
  Descriptor *this_local;
  
  local_14 = index;
  pDStack_10 = this;
  iVar1 = real_oneof_decl_count(this);
  if (index < iVar1) {
    pOVar3 = oneof_decl(this,local_14);
    return pOVar3;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
             ,0xa8d,"index < real_oneof_decl_count()");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_28);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_15,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_28);
}

Assistant:

inline const OneofDescriptor* Descriptor::real_oneof_decl(int index) const {
  ABSL_DCHECK(index < real_oneof_decl_count());
  return oneof_decl(index);
}